

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_converter.hpp
# Opt level: O1

longdouble *
trial::protocol::json::detail::power10<long_double>(longdouble *__return_storage_ptr__,int exponent)

{
  longdouble *plVar1;
  
  if ((uint)__return_storage_ptr__ < 0xb) {
    return (longdouble *)(((ulong)__return_storage_ptr__ & 0xffffffff) << 4);
  }
  plVar1 = (longdouble *)powl();
  return plVar1;
}

Assistant:

RealT power10(int exponent)
{
    switch (exponent)
    {
    case 0: return RealT(1.0);
    case 1: return RealT(1E1);
    case 2: return RealT(1E2);
    case 3: return RealT(1E3);
    case 4: return RealT(1E4);
    case 5: return RealT(1E5);
    case 6: return RealT(1E6);
    case 7: return RealT(1E7);
    case 8: return RealT(1E8);
    case 9: return RealT(1E9);
    case 10: return RealT(1E10);
    default: return std::pow(RealT(10), exponent);
    }
}